

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

void __thiscall smf::MidiMessage::setKeyNumber(MidiMessage *this,int value)

{
  byte *pbVar1;
  bool bVar2;
  
  bVar2 = isNote(this);
  if ((bVar2) ||
     ((pbVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
      (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pbVar1 == 3 && ((*pbVar1 & 0xf0) == 0xa0)))) {
    if (*(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
        *(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start < 2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
    }
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)value;
  }
  return;
}

Assistant:

void MidiMessage::setKeyNumber(int value) {
	if (isNote() || isAftertouch()) {
		setP1(value & 0xff);
	} else {
		// don't do anything since this is not a note-related message.
	}
}